

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrassembly.cpp
# Opt level: O2

void __thiscall
TPZDohrAssembly<std::complex<long_double>_>::ExtractCoarse
          (TPZDohrAssembly<std::complex<long_double>_> *this,int isub,
          TPZFMatrix<std::complex<long_double>_> *global,
          TPZFMatrix<std::complex<long_double>_> *local)

{
  TPZVec<int> *pTVar1;
  int iVar2;
  complex<long_double> *pcVar3;
  int iVar4;
  ulong uVar5;
  ulong row;
  ulong col;
  ulong uVar6;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined8 local_48;
  undefined8 uStack_40;
  
  pTVar1 = (this->fCoarseEqs).fStore;
  uVar6 = pTVar1[isub].fNElements;
  uVar5 = (global->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fCol;
  iVar2 = (int)uVar6;
  iVar4 = (int)uVar5;
  (*(local->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.super_TPZSavable.
    _vptr_TPZSavable[0xd])(local,(long)iVar2,(long)iVar4);
  col = 0;
  uVar6 = uVar6 & 0xffffffff;
  if (iVar2 < 1) {
    uVar6 = col;
  }
  uVar5 = uVar5 & 0xffffffff;
  if (iVar4 < 1) {
    uVar5 = col;
  }
  for (; col != uVar5; col = col + 1) {
    for (row = 0; uVar6 != row; row = row + 1) {
      (*(global->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.super_TPZSavable.
        _vptr_TPZSavable[0x24])(&local_58,global,(long)pTVar1[isub].fStore[row],col);
      pcVar3 = TPZFMatrix<std::complex<long_double>_>::operator()(local,row,col);
      *(undefined4 *)pcVar3->_M_value = local_58;
      *(undefined4 *)(pcVar3->_M_value + 4) = uStack_54;
      *(undefined4 *)(pcVar3->_M_value + 8) = uStack_50;
      *(undefined4 *)(pcVar3->_M_value + 0xc) = uStack_4c;
      *(undefined8 *)(pcVar3->_M_value + 0x10) = local_48;
      *(undefined8 *)(pcVar3->_M_value + 0x18) = uStack_40;
    }
  }
  return;
}

Assistant:

void TPZDohrAssembly<TVar>::ExtractCoarse(int isub, const TPZFMatrix<TVar> &global, TPZFMatrix<TVar> &local) const
{
	TPZVec<int> &avec = fCoarseEqs[isub];
	int neq = avec.NElements();
	int ieq;
    int ncols = global.Cols();
	local.Resize(neq,ncols);
    for (int ic=0; ic<ncols; ic++) 
    {
        for(ieq=0; ieq<neq; ieq++)
        {
            local(ieq,ic) = global.GetVal(avec[ieq],ic);
        }
    }
}